

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O0

PackedFunc * __thiscall
tvm::runtime::Module::GetFunction
          (PackedFunc *__return_storage_ptr__,Module *this,string *name,bool query_imports)

{
  bool bVar1;
  element_type *peVar2;
  PackedFunc local_78;
  __shared_ptr_access<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_58;
  Module *m;
  iterator __end3;
  iterator __begin3;
  vector<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_> *__range3;
  bool query_imports_local;
  string *name_local;
  Module *this_local;
  PackedFunc *pf;
  
  peVar2 = std::
           __shared_ptr_access<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  (*peVar2->_vptr_ModuleNode[3])(__return_storage_ptr__,peVar2,name,this);
  bVar1 = PackedFunc::operator!=(__return_storage_ptr__,(nullptr_t)0x0);
  if ((!bVar1) && (query_imports)) {
    peVar2 = std::
             __shared_ptr_access<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    __end3 = std::vector<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_>::begin
                       (&peVar2->imports_);
    m = (Module *)
        std::vector<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_>::end
                  (&peVar2->imports_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<tvm::runtime::Module_*,_std::vector<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_>_>
                                       *)&m), bVar1) {
      local_58 = (__shared_ptr_access<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)__gnu_cxx::
                    __normal_iterator<tvm::runtime::Module_*,_std::vector<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_>_>
                    ::operator*(&__end3);
      peVar2 = std::
               __shared_ptr_access<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_58);
      (*peVar2->_vptr_ModuleNode[3])(&local_78,peVar2,name,local_58);
      PackedFunc::operator=(__return_storage_ptr__,&local_78);
      PackedFunc::~PackedFunc(&local_78);
      bVar1 = PackedFunc::operator!=(__return_storage_ptr__,(nullptr_t)0x0);
      if (bVar1) {
        return __return_storage_ptr__;
      }
      __gnu_cxx::
      __normal_iterator<tvm::runtime::Module_*,_std::vector<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_>_>
      ::operator++(&__end3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline PackedFunc Module::GetFunction(const std::string &name, bool query_imports) {
  PackedFunc pf = node_->GetFunction(name, node_);
  if (pf != nullptr)
    return pf;
  if (query_imports) {
    for (const Module &m : node_->imports_) {
      pf = m.node_->GetFunction(name, m.node_);
      if (pf != nullptr)
        return pf;
    }
  }
  return pf;
}